

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O2

char * format_mode(GLFWvidmode *mode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  undefined4 extraout_var;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = mode->width;
  uVar2 = mode->height;
  uVar5 = uVar1;
  uVar6 = uVar2;
  while (uVar6 != 0) {
    in_RAX = (long)(int)uVar5 / (long)(int)uVar6 & 0xffffffff;
    uVar4 = (int)uVar5 % (int)uVar6;
    uVar5 = uVar6;
    uVar6 = uVar4;
  }
  iVar3 = snprintf(format_mode::buffer,0x200,"%i x %i x %i (%i:%i) (%i %i %i) %i Hz",(ulong)uVar1,
                   (ulong)uVar2,(ulong)(uint)(mode->greenBits + mode->redBits + mode->blueBits),
                   (long)(int)uVar1 / (long)(int)uVar5 & 0xffffffff,
                   (long)(int)uVar2 / (long)(int)uVar5 & 0xffffffff,(ulong)(uint)mode->redBits,
                   (ulong)(uint)mode->greenBits,(ulong)(uint)mode->blueBits,
                   (ulong)(uint)mode->refreshRate,in_RAX);
  format_mode::buffer[0x1ff] = '\0';
  return (char *)CONCAT44(extraout_var,iVar3);
}

Assistant:

static const char* format_mode(const GLFWvidmode* mode)
{
    static char buffer[512];
    const int gcd = euclid(mode->width, mode->height);

    snprintf(buffer,
             sizeof(buffer),
             "%i x %i x %i (%i:%i) (%i %i %i) %i Hz",
             mode->width, mode->height,
             mode->redBits + mode->greenBits + mode->blueBits,
             mode->width / gcd, mode->height / gcd,
             mode->redBits, mode->greenBits, mode->blueBits,
             mode->refreshRate);

    buffer[sizeof(buffer) - 1] = '\0';
    return buffer;
}